

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::iterate(QueryCase *this)

{
  ostringstream *this_00;
  float *pfVar1;
  TestLog *log;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  int ndx;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  *p_Var7;
  BoundingBox *pBVar8;
  pointer pBVar9;
  BoundingBox *pBVar10;
  TestContext *pTVar11;
  size_t __n;
  size_t __n_00;
  int ndx_1;
  pointer pBVar12;
  size_t sVar13;
  int coordNdx;
  long lVar14;
  int ndx_2;
  int ndx_6;
  pointer pBVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  BoundingBox *local_380;
  pointer local_378;
  CallLogWrapper gl;
  string local_348;
  vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  cases;
  ScopedLogSection section;
  Enum<int,_1UL> local_300;
  long local_2f0;
  long local_2e8;
  Enum<int,_1UL> local_2e0;
  Enum<int,_1UL> local_2d0;
  Enum<int,_1UL> local_2c0;
  Enum<int,_1UL> local_2b0;
  Enum<int,_1UL> local_2a0;
  Enum<int,_1UL> local_290;
  StateQueryMemoryWriteGuard<float[8]> state;
  float local_200 [16];
  BoundingBox boundingBox;
  Random rnd;
  
  if ((Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::QueryCase::iterate()::
                                   fixedCases), iVar5 != 0)) {
    iterate::fixedCases[0].max.m_data = (float  [4])ZEXT816(0);
    iterate::fixedCases[0].min.m_data = (float  [4])ZEXT816(0);
    iterate::fixedCases[1].min.m_data[0] = _DAT_0163f5b0;
    iterate::fixedCases[1].min.m_data[1] = _UNK_0163f5b4;
    iterate::fixedCases[1].min.m_data[2] = _UNK_0163f5b8;
    iterate::fixedCases[1].min.m_data[3] = _UNK_0163f5bc;
    iterate::fixedCases[1].max.m_data[0] = _DAT_018d1900;
    iterate::fixedCases[1].max.m_data[1] = _UNK_018d1904;
    iterate::fixedCases[1].max.m_data[2] = _UNK_018d1908;
    iterate::fixedCases[1].max.m_data[3] = _UNK_018d190c;
    iterate::fixedCases[2].min.m_data = (float  [4])ZEXT816(0);
    iterate::fixedCases[2].max.m_data[0] = _DAT_018d1910;
    iterate::fixedCases[2].max.m_data[1] = _UNK_018d1914;
    iterate::fixedCases[2].max.m_data[2] = _UNK_018d1918;
    iterate::fixedCases[2].max.m_data[3] = _UNK_018d191c;
    iterate::fixedCases[3].min.m_data[0] = _DAT_016977a0;
    iterate::fixedCases[3].min.m_data[1] = _UNK_016977a4;
    iterate::fixedCases[3].min.m_data[2] = _UNK_016977a8;
    iterate::fixedCases[3].min.m_data[3] = _UNK_016977ac;
    iterate::fixedCases[3].max.m_data[0] = _DAT_018d1920;
    iterate::fixedCases[3].max.m_data[1] = _UNK_018d1924;
    iterate::fixedCases[3].max.m_data[2] = _UNK_018d1928;
    iterate::fixedCases[3].max.m_data[3] = _UNK_018d192c;
    iterate::fixedCases[4].min.m_data[0] = _DAT_0166f110;
    iterate::fixedCases[4].min.m_data[1] = _UNK_0166f114;
    iterate::fixedCases[4].min.m_data[2] = _UNK_0166f118;
    iterate::fixedCases[4].min.m_data[3] = _UNK_0166f11c;
    iterate::fixedCases[4].max.m_data[0] = _DAT_0167e920;
    iterate::fixedCases[4].max.m_data[1] = _UNK_0167e924;
    iterate::fixedCases[4].max.m_data[2] = _UNK_0167e928;
    iterate::fixedCases[4].max.m_data[3] = _UNK_0167e92c;
    iterate::fixedCases[5].min.m_data[0] = _DAT_018d1930;
    iterate::fixedCases[5].min.m_data[1] = _UNK_018d1934;
    iterate::fixedCases[5].min.m_data[2] = _UNK_018d1938;
    iterate::fixedCases[5].min.m_data[3] = _UNK_018d193c;
    iterate::fixedCases[5].max.m_data[0] = _DAT_018d1940;
    iterate::fixedCases[5].max.m_data[1] = _UNK_018d1944;
    iterate::fixedCases[5].max.m_data[2] = _UNK_018d1948;
    iterate::fixedCases[5].max.m_data[3] = _UNK_018d194c;
    __cxa_guard_release(&Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  glu::CallLogWrapper::CallLogWrapper(&gl,(Functions *)CONCAT44(extraout_var,iVar5),pTVar11->m_log);
  deRandom_init(&rnd.m_rnd,0xde3210);
  cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar13 = 6;
  p_Var7 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
            *)std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
              ::_M_check_len(&cases,6,"vector::_M_range_insert");
  local_380 = std::
              _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
              ::_M_allocate(p_Var7,sVar13);
  pBVar8 = std::
           __uninitialized_copy_a<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                     ((BoundingBox *)0x0,(BoundingBox *)0x0,local_380,
                      (allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox> *)
                      pTVar11);
  pBVar8 = std::
           __uninitialized_copy_a<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                     (iterate::fixedCases,
                      (BoundingBox *)
                      &Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases,pBVar8,
                      (allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox> *)
                      pTVar11);
  pBVar8 = std::
           __uninitialized_copy_a<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                     ((BoundingBox *)0x0,(BoundingBox *)0x0,pBVar8,
                      (allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox> *)
                      pTVar11);
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                   *)0x0,(pointer)0x0,__n);
  pBVar12 = local_380 + (long)p_Var7;
  cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ._M_impl.super__Vector_impl_data._M_start = local_380;
  cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar12;
  for (iVar5 = 0;
      cases.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
      ._M_impl.super__Vector_impl_data._M_finish = pBVar8, iVar5 != 9; iVar5 = iVar5 + 1) {
    pBVar10 = &boundingBox;
    BoundingBox::BoundingBox(pBVar10);
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      fVar16 = deRandom_getFloat(&rnd.m_rnd);
      (pBVar10->min).m_data[0] = fVar16 * 8.0 + -4.0;
      pBVar10 = (BoundingBox *)((pBVar10->min).m_data + 1);
    }
    if (pBVar8 == pBVar12) {
      sVar13 = 1;
      p_Var7 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                *)std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                  ::_M_check_len(&cases,1,"vector::_M_realloc_insert");
      pBVar9 = std::
               _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
               ::_M_allocate(p_Var7,sVar13);
      BoundingBox::BoundingBox
                ((BoundingBox *)((long)pBVar9 + ((long)pBVar12 - (long)local_380)),&boundingBox);
      pBVar10 = std::
                __uninitialized_copy_a<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                          (local_380,pBVar8,pBVar9,
                           (allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                            *)pTVar11);
      pBVar8 = std::
               __uninitialized_copy_a<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*,deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>
                         (pBVar8,pBVar8,pBVar10 + 1,
                          (allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox> *
                          )pTVar11);
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
      ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                       *)local_380,(pointer)((long)pBVar12 - (long)local_380 >> 5),__n_00);
      pBVar12 = pBVar9 + (long)p_Var7;
      local_380 = pBVar9;
      cases.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
      ._M_impl.super__Vector_impl_data._M_start = pBVar9;
      cases.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar12;
    }
    else {
      BoundingBox::BoundingBox(pBVar8,&boundingBox);
      pBVar8 = pBVar8 + 1;
    }
  }
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pBVar12 = cases.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (ostringstream *)(boundingBox.min.m_data + 2);
  local_2f0 = (long)(int)((ulong)((long)pBVar8 -
                                 (long)cases.
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_378 = cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
              ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = 0;
LAB_01385192:
  if (local_2f0 <= lVar14) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
    ::~vector(&cases);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&boundingBox,"Iteration",(allocator<char> *)&local_2e0);
  local_2e8 = lVar14 + 1;
  local_300.m_getName = (GetNameFunc)CONCAT44(local_300.m_getName._4_4_,(int)local_2e8);
  de::toString<int>(&local_348,(int *)&local_300);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                 "Iteration ",&local_348);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&boundingBox,(string *)&state);
  std::__cxx11::string::~string((string *)&state);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&boundingBox);
  glu::CallLogWrapper::glPrimitiveBoundingBox
            (&gl,pBVar12[lVar14].min.m_data[0],pBVar12[lVar14].min.m_data[1],
             pBVar12[lVar14].min.m_data[2],pBVar12[lVar14].min.m_data[3],
             pBVar12[lVar14].max.m_data[0],pBVar12[lVar14].max.m_data[1],
             pBVar12[lVar14].max.m_data[2],pBVar12[lVar14].max.m_data[3]);
  switch(this->m_method) {
  case QUERY_FLOAT:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::StateQueryMemoryWriteGuard
              (&state);
    glu::CallLogWrapper::glGetFloatv(&gl,0x92be,state.m_value);
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar6,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x138);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                      (&state,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (!bVar4) goto LAB_01385df1;
    boundingBox.min.m_data._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    pfVar1 = boundingBox.min.m_data + 2;
    std::operator<<((ostream *)pfVar1,"glGetFloatv returned ");
    local_348._M_dataplus._M_p = (pointer)state.m_value;
    local_348._M_string_length = (size_type)state.m_postguard;
    tcu::Format::operator<<((ostream *)pfVar1,(Array<float_*> *)&local_348);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
    pBVar15 = pBVar12 + lVar14;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    bVar4 = false;
    pBVar9 = local_378;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      bVar4 = (bool)(bVar4 | state.m_value[lVar14] != (pBVar9->min).m_data[0]);
      pBVar9 = (pointer)((pBVar9->min).m_data + 1);
    }
    if (!bVar4) break;
    boundingBox.min.m_data._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    pfVar1 = boundingBox.min.m_data + 2;
    std::operator<<((ostream *)pfVar1,"Error, unexpected value\n");
    std::operator<<((ostream *)pfVar1,"Expected [");
    std::ostream::operator<<(pfVar1,(pBVar15->min).m_data[0]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->min).m_data[1]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->min).m_data[2]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->min).m_data[3]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->max).m_data[0]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->max).m_data[1]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->max).m_data[2]);
    std::operator<<((ostream *)pfVar1,", ");
    std::ostream::operator<<(pfVar1,(pBVar15->max).m_data[3]);
    std::operator<<((ostream *)pfVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_01385d88;
  case QUERY_BOOLEAN:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::
    StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[8]> *)&state);
    glu::CallLogWrapper::glGetBooleanv(&gl,0x92be,(GLboolean *)(state.m_preguard + 2));
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar6,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x1bc);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char[8]> *)&state,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (!bVar4) goto LAB_01385df1;
    boundingBox.min.m_data._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    pfVar1 = boundingBox.min.m_data + 2;
    std::operator<<((ostream *)pfVar1,"glGetBooleanv returned [");
    local_348._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_348._M_string_length =
         CONCAT44(local_348._M_string_length._4_4_,(uint)state.m_preguard[2]._0_1_);
    tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_348,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_300.m_getName = glu::getBooleanName;
    local_300.m_value = (int)state.m_preguard[2]._1_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_300,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_2e0.m_getName = glu::getBooleanName;
    local_2e0.m_value = (int)state.m_preguard[2]._2_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_2e0,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_290.m_getName = glu::getBooleanName;
    local_290.m_value = (int)state.m_preguard[2]._3_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_290,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_2a0.m_getName = glu::getBooleanName;
    local_2a0.m_value = (int)state.m_preguard[3]._0_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_2a0,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_2b0.m_getName = glu::getBooleanName;
    local_2b0.m_value = (int)state.m_preguard[3]._1_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_2b0,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_2c0.m_getName = glu::getBooleanName;
    local_2c0.m_value = (int)state.m_preguard[3]._2_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_2c0,(ostream *)pfVar1);
    std::operator<<((ostream *)pfVar1,", ");
    local_2d0.m_getName = glu::getBooleanName;
    local_2d0.m_value = (int)state.m_preguard[3]._3_1_;
    tcu::Format::Enum<int,_1UL>::toStream(&local_2d0,(ostream *)pfVar1);
    std::operator<<((ostream *)(boundingBox.min.m_data + 2),"]\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    bVar4 = false;
    pBVar9 = local_378;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      bVar4 = (bool)(bVar4 | (bool)*(char *)((long)state.m_preguard + lVar14 + 8) !=
                             ((pBVar9->min).m_data[0] != 0.0));
      pBVar9 = (pointer)((pBVar9->min).m_data + 1);
    }
    if (bVar4) {
      boundingBox.min.m_data._0_8_ =
           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
      std::operator<<((ostream *)(boundingBox.min.m_data + 2),"Error, unexpected value\n");
      std::operator<<((ostream *)(boundingBox.min.m_data + 2),"Expected [");
      lVar14 = 0;
      pBVar9 = local_378;
      do {
        if (lVar14 != 0) {
          if (lVar14 == 8) goto LAB_01385d58;
          std::operator<<((ostream *)(boundingBox.min.m_data + 2),", ");
        }
        pcVar3 = "mapped_ == GL_FALSE";
        if ((pBVar9->min).m_data[0] != 0.0) {
          pcVar3 = "mapped_ == GL_TRUE";
        }
        if (NAN((pBVar9->min).m_data[0])) {
          pcVar3 = "mapped_ == GL_TRUE";
        }
        std::operator<<((ostream *)(boundingBox.min.m_data + 2),pcVar3 + 0xb);
        lVar14 = lVar14 + 1;
        pBVar9 = (pointer)((pBVar9->min).m_data + 1);
      } while( true );
    }
    break;
  case QUERY_INT:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[8]> *)&state);
    glu::CallLogWrapper::glGetIntegerv(&gl,0x92be,(GLint *)state.m_value);
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar6,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x15a);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[8]> *)&state,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar4) {
      boundingBox.min.m_data._0_8_ =
           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
      pfVar1 = boundingBox.min.m_data + 2;
      std::operator<<((ostream *)pfVar1,"glGetIntegerv returned ");
      local_348._M_dataplus._M_p = (pointer)state.m_value;
      local_348._M_string_length = (size_type)state.m_postguard;
      tcu::Format::operator<<((ostream *)pfVar1,(Array<int_*> *)&local_348);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
      bVar4 = false;
      pBVar9 = local_378;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        fVar18 = state.m_value[lVar14];
        fVar16 = (pBVar9->min).m_data[0];
        fVar17 = ceilf(fVar16 + -0.5);
        if (fVar18 != (float)(int)fVar17) {
          fVar16 = floorf(fVar16 + 0.5);
          bVar4 = (bool)(bVar4 | fVar18 != (float)(int)fVar16);
        }
        pBVar9 = (pointer)((pBVar9->min).m_data + 1);
      }
      if (!bVar4) break;
      boundingBox.min.m_data._0_8_ =
           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
      std::operator<<((ostream *)(boundingBox.min.m_data + 2),"Error, unexpected value\n");
      std::operator<<((ostream *)(boundingBox.min.m_data + 2),"Expected [");
      pBVar9 = local_378;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        fVar16 = (pBVar9->min).m_data[0];
        fVar18 = ceilf(fVar16 + -0.5);
        fVar16 = floorf(fVar16 + 0.5);
        if (lVar14 != 0) {
          std::operator<<((ostream *)(boundingBox.min.m_data + 2),", ");
        }
        iVar5 = (int)fVar18;
        if (iVar5 == (int)fVar16) {
          std::ostream::operator<<(boundingBox.min.m_data + 2,iVar5);
        }
        else {
          pfVar1 = boundingBox.min.m_data + 2;
          std::operator<<((ostream *)pfVar1,"{");
          std::ostream::operator<<(pfVar1,iVar5);
          std::operator<<((ostream *)pfVar1,", ");
          std::ostream::operator<<(pfVar1,(int)fVar16);
          std::operator<<((ostream *)pfVar1,"}");
        }
        pBVar9 = (pointer)((pBVar9->min).m_data + 1);
      }
      std::operator<<((ostream *)(boundingBox.min.m_data + 2),"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01385de7:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    }
    goto LAB_01385df1;
  case QUERY_INT64:
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long[8]> *)&state);
    glu::CallLogWrapper::glGetInteger64v(&gl,0x92be,(GLint64 *)state.m_postguard);
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar6,"query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x18b);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<long[8]> *)&state,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (!bVar4) goto LAB_01385df1;
    boundingBox.min.m_data._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    pfVar1 = boundingBox.min.m_data + 2;
    std::operator<<((ostream *)pfVar1,"glGetInteger64v returned ");
    local_348._M_dataplus._M_p = (pointer)state.m_postguard;
    local_348._M_string_length = (size_type)local_200;
    tcu::Format::operator<<((ostream *)pfVar1,(Array<long_*> *)&local_348);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
    bVar4 = false;
    pBVar9 = local_378;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      lVar2 = *(long *)(state.m_postguard + lVar14 * 2);
      fVar16 = (pBVar9->min).m_data[0];
      fVar18 = ceilf(fVar16 + -0.5);
      if (lVar2 != (long)fVar18) {
        fVar16 = floorf(fVar16 + 0.5);
        bVar4 = (bool)(bVar4 | lVar2 != (long)fVar16);
      }
      pBVar9 = (pointer)((pBVar9->min).m_data + 1);
    }
    if (bVar4) {
      boundingBox.min.m_data._0_8_ =
           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Error, unexpected value\n");
      std::operator<<((ostream *)this_00,"Expected [");
      pBVar9 = local_378;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        fVar16 = (pBVar9->min).m_data[0];
        fVar18 = ceilf(fVar16 + -0.5);
        fVar16 = floorf(fVar16 + 0.5);
        if (lVar14 != 0) {
          std::operator<<((ostream *)this_00,", ");
        }
        if ((long)fVar18 == (long)fVar16) {
          std::ostream::_M_insert<long>((long)this_00);
        }
        else {
          std::operator<<((ostream *)this_00,"{");
          std::ostream::_M_insert<long>((long)this_00);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::_M_insert<long>((long)this_00);
          std::operator<<((ostream *)this_00,"}");
        }
        pBVar9 = (pointer)((pBVar9->min).m_data + 1);
      }
      std::operator<<((ostream *)this_00,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01385de7;
    }
  }
  goto switchD_0138529c_default;
LAB_01385d58:
  std::operator<<((ostream *)(boundingBox.min.m_data + 2),"]");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&boundingBox,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01385d88:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(boundingBox.min.m_data + 2));
LAB_01385df1:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Unexpected query result");
switchD_0138529c_default:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  local_378 = local_378 + 1;
  lVar14 = local_2e8;
  goto LAB_01385192;
}

Assistant:

QueryCase::IterateResult QueryCase::iterate (void)
{
	static const BoundingBox fixedCases[] =
	{
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f) },
		{ tcu::Vec4(-0.0f, -0.0f, -0.0f, -0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f, -0.0f) },
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 1.0f,  1.0f,  1.0f, -1.0f) },
		{ tcu::Vec4( 2.0f,  2.0f,  2.0f,  2.0f), tcu::Vec4( 1.5f,  1.5f,  1.5f,  1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  1.0f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  0.3f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.2f) },
	};

	const int					numRandomCases	= 9;
	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	de::Random					rnd				(0xDE3210);
	std::vector<BoundingBox>	cases;

	cases.insert(cases.begin(), DE_ARRAY_BEGIN(fixedCases), DE_ARRAY_END(fixedCases));
	for (int ndx = 0; ndx < numRandomCases; ++ndx)
	{
		BoundingBox	boundingBox;

		// parameter evaluation order is not guaranteed, cannot just do "max = (rand(), rand(), ...)
		for (int coordNdx = 0; coordNdx < 8; ++coordNdx)
			boundingBox.getComponentAccess(coordNdx) = rnd.getFloat(-4.0f, 4.0f);

		cases.push_back(boundingBox);
	}

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int caseNdx = 0; caseNdx < (int)cases.size(); ++caseNdx)
	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Iteration", "Iteration " + de::toString(caseNdx+1));
		const BoundingBox&			boundingBox	= cases[caseNdx];

		gl.glPrimitiveBoundingBox(boundingBox.min.x(), boundingBox.min.y(), boundingBox.min.z(), boundingBox.min.w(),
								  boundingBox.max.x(), boundingBox.max.y(), boundingBox.max.z(), boundingBox.max.w());

		if (!verifyState(gl, boundingBox))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected query result");
	}

	return STOP;
}